

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_output_stores_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::EliminateDeadOutputStoresPass::AnyLocsAreLive
          (EliminateDeadOutputStoresPass *this,uint32_t start,uint32_t count)

{
  undefined8 in_RAX;
  iterator iVar1;
  uint uVar2;
  undefined8 uStack_28;
  
  uVar2 = count + start;
  uStack_28 = in_RAX;
  while( true ) {
    uStack_28 = CONCAT44(start,(undefined4)uStack_28);
    if (uVar2 <= start) break;
    iVar1 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&this->live_locs_->_M_h,(key_type *)((long)&uStack_28 + 4));
    if (iVar1.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) break;
    start = uStack_28._4_4_ + 1;
  }
  return start < uVar2;
}

Assistant:

bool EliminateDeadOutputStoresPass::AnyLocsAreLive(uint32_t start,
                                                   uint32_t count) {
  auto finish = start + count;
  for (uint32_t u = start; u < finish; ++u) {
    if (live_locs_->find(u) != live_locs_->end()) return true;
  }
  return false;
}